

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O1

bool __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::grant_ownership
          (image<crnlib::color_quad<unsigned_char,_int>_> *this,
          color_quad<unsigned_char,_int> *pPixels,uint width,uint height,uint pitch,uint flags)

{
  color_quad<unsigned_char,_int> *pcVar1;
  uint uVar2;
  
  if (pitch == 0xffffffff) {
    pitch = width;
  }
  if ((width <= pitch &&
       (height != 0 && (width != 0 && pPixels != (color_quad<unsigned_char,_int> *)0x0))) &&
     (this->m_pPixels != pPixels)) {
    this->m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
    pcVar1 = (this->m_pixel_buf).m_p;
    if (pcVar1 != (color_quad<unsigned_char,_int> *)0x0) {
      crnlib_free(pcVar1);
      (this->m_pixel_buf).m_p = (color_quad<unsigned_char,_int> *)0x0;
      (this->m_pixel_buf).m_size = 0;
      (this->m_pixel_buf).m_capacity = 0;
    }
    this->m_width = 0;
    this->m_height = 0;
    this->m_pitch = 0;
    this->m_total = 0;
    this->m_comp_flags = 0xf;
    uVar2 = pitch * height;
    pcVar1 = (this->m_pixel_buf).m_p;
    if ((pPixels + uVar2 <= pcVar1) || (pcVar1 + (this->m_pixel_buf).m_capacity <= pPixels)) {
      if (pPixels == (color_quad<unsigned_char,_int> *)0x0) {
        if (uVar2 == 0) goto LAB_0011cc35;
      }
      else if (uVar2 != 0) {
LAB_0011cc35:
        if (pcVar1 != (color_quad<unsigned_char,_int> *)0x0) {
          crnlib_free(pcVar1);
          (this->m_pixel_buf).m_p = (color_quad<unsigned_char,_int> *)0x0;
          (this->m_pixel_buf).m_size = 0;
          (this->m_pixel_buf).m_capacity = 0;
        }
        (this->m_pixel_buf).m_p = pPixels;
        (this->m_pixel_buf).m_size = uVar2;
        (this->m_pixel_buf).m_capacity = uVar2;
        this->m_pPixels = pPixels;
        this->m_width = width;
        this->m_height = height;
        this->m_pitch = pitch;
        this->m_total = uVar2;
        this->m_comp_flags = flags;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool grant_ownership(color_type* pPixels, uint width, uint height, uint pitch = UINT_MAX, uint flags = pixel_format_helpers::cDefaultCompFlags) {
    if (pitch == UINT_MAX)
      pitch = width;

    if ((!pPixels) || (!width) || (!height) || (pitch < width)) {
      CRNLIB_ASSERT(0);
      return false;
    }

    if (pPixels == get_ptr()) {
      CRNLIB_ASSERT(0);
      return false;
    }

    clear();

    if (!m_pixel_buf.grant_ownership(pPixels, height * pitch, height * pitch))
      return false;

    m_pPixels = pPixels;

    m_width = width;
    m_height = height;
    m_pitch = pitch;
    m_total = pitch * height;
    m_comp_flags = flags;

    return true;
  }